

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engrave.c
# Opt level: O0

void del_engr(level *lev,engr *ep)

{
  engr *local_20;
  engr *ept;
  engr *ep_local;
  level *lev_local;
  
  if (ep == lev->lev_engr) {
    lev->lev_engr = ep->nxt_engr;
  }
  else {
    for (local_20 = lev->lev_engr; local_20 != (engr *)0x0; local_20 = local_20->nxt_engr) {
      if (local_20->nxt_engr == ep) {
        local_20->nxt_engr = ep->nxt_engr;
        break;
      }
    }
    if (local_20 == (engr *)0x0) {
      warning("Error in del_engr?");
      return;
    }
  }
  free(ep);
  return;
}

Assistant:

void del_engr(struct level *lev, struct engr *ep)
{
	if (ep == lev->lev_engr) {
		lev->lev_engr = ep->nxt_engr;
	} else {
		struct engr *ept;

		for (ept = lev->lev_engr; ept; ept = ept->nxt_engr)
		    if (ept->nxt_engr == ep) {
			ept->nxt_engr = ep->nxt_engr;
			break;
		    }
		if (!ept) {
		    warning("Error in del_engr?");
		    return;
		}
	}
	dealloc_engr(ep);
}